

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

roaring_bitmap_t * roaring_from_sentinel_array(int *data,_Bool copy_on_write)

{
  roaring_bitmap_t *r;
  
  r = roaring_bitmap_create();
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | copy_on_write;
  for (; *data != 0xffffffff; data = (int *)((uint32_t *)data + 1)) {
    roaring_bitmap_add(r,*data);
  }
  return r;
}

Assistant:

static roaring_bitmap_t *roaring_from_sentinel_array(int *data,
                                                     bool copy_on_write) {
    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, copy_on_write);

    for (; *data != -1; ++data) {
        roaring_bitmap_add(ans, *data);
    }
    return ans;
}